

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

int entropy_gather_internal(mbedtls_entropy_context *ctx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  size_t olen;
  uchar buf [128];
  
  iVar3 = ctx->source_count;
  if (iVar3 == 0) {
    iVar2 = -0x40;
  }
  else {
    piVar4 = &ctx->source[0].strong;
    iVar2 = -0x3c;
    bVar1 = false;
    for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
      if (*piVar4 == 1) {
        bVar1 = true;
      }
      olen = 0;
      iVar2 = (*((mbedtls_entropy_source_state *)(piVar4 + -8))->f_source)
                        (*(void **)(piVar4 + -6),buf,0x80,&olen);
      if (iVar2 != 0) goto LAB_0010c6e6;
      if (olen != 0) {
        iVar3 = entropy_update(ctx,(uchar)lVar5,buf,olen);
        if (iVar3 != 0) {
          return iVar3;
        }
        *(size_t *)(piVar4 + -4) = *(size_t *)(piVar4 + -4) + olen;
      }
      iVar3 = ctx->source_count;
      piVar4 = piVar4 + 10;
      iVar2 = 0;
    }
    if (!bVar1) {
      iVar2 = -0x3d;
    }
LAB_0010c6e6:
    mbedtls_platform_zeroize(buf,0x80);
  }
  return iVar2;
}

Assistant:

static int entropy_gather_internal( mbedtls_entropy_context *ctx )
{
    int ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
    int i;
    int have_one_strong = 0;
    unsigned char buf[MBEDTLS_ENTROPY_MAX_GATHER];
    size_t olen;

    if( ctx->source_count == 0 )
        return( MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED );

    /*
     * Run through our entropy sources
     */
    for( i = 0; i < ctx->source_count; i++ )
    {
        if( ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG )
            have_one_strong = 1;

        olen = 0;
        if( ( ret = ctx->source[i].f_source( ctx->source[i].p_source,
                        buf, MBEDTLS_ENTROPY_MAX_GATHER, &olen ) ) != 0 )
        {
            goto cleanup;
        }

        /*
         * Add if we actually gathered something
         */
        if( olen > 0 )
        {
            if( ( ret = entropy_update( ctx, (unsigned char) i,
                                        buf, olen ) ) != 0 )
                return( ret );
            ctx->source[i].size += olen;
        }
    }

    if( have_one_strong == 0 )
        ret = MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE;

cleanup:
    mbedtls_platform_zeroize( buf, sizeof( buf ) );

    return( ret );
}